

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_server.cpp
# Opt level: O2

void __thiscall
cab_server::cab_server
          (cab_server *this,application *application,io_service *io_service,uint16_t port)

{
  ostream *poVar1;
  data_union local_34;
  
  this->_application = application;
  this->_io_service = io_service;
  local_34.base.sa_data[6] = '\0';
  local_34.base.sa_data[7] = '\0';
  local_34.base.sa_data[8] = '\0';
  local_34.base.sa_data[9] = '\0';
  local_34.base.sa_data[10] = '\0';
  local_34.base.sa_data[0xb] = '\0';
  local_34.base.sa_data[0xc] = '\0';
  local_34.base.sa_data[0xd] = '\0';
  local_34._16_8_ = 0;
  local_34.v6.sin6_scope_id = 0;
  local_34.v4.sin_port = port << 8 | port >> 8;
  local_34.base.sa_family = 2;
  local_34.v6.sin6_flowinfo = 0;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->_acceptor,io_service,(endpoint_type *)&local_34.base,true,(type *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"Cab server Listening on *:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,port);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

cab_server::cab_server(application& application, boost::asio::io_service& io_service, std::uint16_t port):
    _application(application),
    _io_service(io_service),
    _acceptor(io_service, boost::asio::ip::tcp::endpoint(boost::asio::ip::tcp::v4(), port))
{
    std::cout << "Cab server Listening on *:" << port << "\n";
}